

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_internals.c
# Opt level: O0

TA_RetCode circBufferFillFrom0ToSize(int size,int *buffer)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  int outIdx;
  int value;
  int i;
  int maxIdx_MyBuf;
  int *MyBuf;
  int MyBuf_Idx;
  int local_MyBuf [4];
  int local_48;
  int local_44;
  int local_40;
  undefined1 *local_38;
  int local_2c;
  undefined1 local_28 [24];
  long local_10;
  int local_8;
  TA_RetCode local_4;
  
  if (in_EDI < 1) {
    local_4 = 0x1411;
  }
  else {
    local_10 = in_RSI;
    local_8 = in_EDI;
    if (in_EDI < 5) {
      local_38 = local_28;
    }
    else {
      local_38 = (undefined1 *)malloc((long)in_EDI << 2);
      if (local_38 == (undefined1 *)0x0) {
        return TA_ALLOC_ERR;
      }
    }
    iVar1 = local_8 + -1;
    local_2c = 0;
    local_48 = 0;
    local_44 = 0;
    for (local_40 = 0; local_40 < local_8; local_40 = local_40 + 1) {
      *(int *)(local_38 + (long)local_2c * 4) = local_44;
      local_2c = local_2c + 1;
      if (iVar1 < local_2c) {
        local_2c = 0;
      }
      local_44 = local_44 + 1;
    }
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      *(undefined4 *)(local_10 + (long)local_48 * 4) =
           *(undefined4 *)(local_38 + (long)local_2c * 4);
      *(int *)(local_38 + (long)local_2c * 4) = local_44;
      local_2c = local_2c + 1;
      if (iVar1 < local_2c) {
        local_2c = 0;
      }
      local_48 = local_48 + 1;
      local_44 = local_44 + 1;
    }
    for (local_40 = 0; local_40 < local_8; local_40 = local_40 + 1) {
      *(undefined4 *)(local_10 + (long)local_48 * 4) =
           *(undefined4 *)(local_38 + (long)local_2c * 4);
      local_2c = local_2c + 1;
      if (iVar1 < local_2c) {
        local_2c = 0;
      }
      local_48 = local_48 + 1;
    }
    if (local_38 != local_28) {
      free(local_38);
    }
    local_4 = TA_SUCCESS;
  }
  return local_4;
}

Assistant:

static TA_RetCode circBufferFillFrom0ToSize( int size, int *buffer )
{
   CIRCBUF_PROLOG(MyBuf,int,4);
   int i, value;
   int outIdx;

   CIRCBUF_INIT(MyBuf,int,size);

   outIdx = 0;

   // 1st Loop: Fill MyBuf with initial values
   //           (must be done).
   value = 0;
   for( i=0; i < size; i++ )
   {
      MyBuf[MyBuf_Idx] = value++;
      CIRCBUF_NEXT(MyBuf);
   }

   // 2nd Loop: Get and Add subsequent values
   //           in MyBuf (optional)
   for( i=0; i < 3; i++ )
   {
      buffer[outIdx++] = MyBuf[MyBuf_Idx];
      MyBuf[MyBuf_Idx] = value++;
      CIRCBUF_NEXT(MyBuf);
   }

   // 3rd Loop: Empty MyBuf (optional)
   for( i=0; i < size; i++ )
   {
      buffer[outIdx++] = MyBuf[MyBuf_Idx];
      CIRCBUF_NEXT(MyBuf);
   }

   CIRCBUF_DESTROY(MyBuf);

   return TA_SUCCESS;
}